

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

void Curl_attach_connection(Curl_easy *data,connectdata *conn)

{
  _func_void_Curl_easy_ptr_connectdata_ptr *UNRECOVERED_JUMPTABLE;
  
  data->conn = conn;
  Curl_uint_spbset_add(&conn->xfers_attached,data->mid);
  if ((conn->handler != (Curl_handler *)0x0) &&
     (UNRECOVERED_JUMPTABLE = conn->handler->attach,
     UNRECOVERED_JUMPTABLE != (_func_void_Curl_easy_ptr_connectdata_ptr *)0x0)) {
    (*UNRECOVERED_JUMPTABLE)(data,conn);
    return;
  }
  return;
}

Assistant:

void Curl_attach_connection(struct Curl_easy *data,
                            struct connectdata *conn)
{
  DEBUGASSERT(data);
  DEBUGASSERT(!data->conn);
  DEBUGASSERT(conn);
  data->conn = conn;
  Curl_uint_spbset_add(&conn->xfers_attached, data->mid);
  if(conn->handler && conn->handler->attach)
    conn->handler->attach(data, conn);
}